

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

cmGlobalGenerator * __thiscall cmake::CreateGlobalGenerator(cmake *this,string *gname)

{
  cmExternalMakefileProjectGenerator *extraGenerator;
  __type _Var1;
  int iVar2;
  undefined4 extraout_var;
  cmGlobalGenerator *this_00;
  undefined4 extraout_var_01;
  const_reference pvVar3;
  string *globalGenerator;
  pointer ppcVar4;
  pointer ppcVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  string name;
  pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extra;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  string local_98;
  cmExternalMakefileProjectGenerator *local_78;
  string local_70 [32];
  string local_50;
  undefined4 extraout_var_00;
  
  for (ppcVar5 = (this->ExtraGenerators).
                 super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppcVar5 !=
      (this->ExtraGenerators).
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
    cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
              (&local_b0,*ppcVar5);
    cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_98,*ppcVar5);
    _Var1 = std::operator==(&local_98,gname);
    std::__cxx11::string::~string((string *)&local_98);
    globalGenerator =
         local_b0.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (_Var1) {
      iVar2 = (*(*ppcVar5)->_vptr_cmExternalMakefileProjectGeneratorFactory[2])();
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&local_b0,0);
      local_78 = (cmExternalMakefileProjectGenerator *)CONCAT44(extraout_var_01,iVar2);
      std::__cxx11::string::string(local_70,(string *)pvVar3);
LAB_00345f02:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b0);
      goto LAB_00345f0c;
    }
    for (; globalGenerator !=
           local_b0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; globalGenerator = globalGenerator + 1) {
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_50,*ppcVar5);
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                (&local_98,globalGenerator,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      _Var1 = std::operator==(&local_98,gname);
      if (_Var1) {
        iVar2 = (*(*ppcVar5)->_vptr_cmExternalMakefileProjectGeneratorFactory[2])();
        local_78 = (cmExternalMakefileProjectGenerator *)CONCAT44(extraout_var,iVar2);
        std::__cxx11::string::string(local_70,(string *)globalGenerator);
        std::__cxx11::string::~string((string *)&local_98);
        goto LAB_00345f02;
      }
      std::__cxx11::string::~string((string *)&local_98);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
  }
  local_78 = (cmExternalMakefileProjectGenerator *)0x0;
  std::__cxx11::string::string(local_70,(string *)gname);
LAB_00345f0c:
  extraGenerator = local_78;
  std::__cxx11::string::string((string *)&local_98,local_70);
  ppcVar4 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppcVar4 ==
        (this->Generators).
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if (extraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
        (*extraGenerator->_vptr_cmExternalMakefileProjectGenerator[1])(extraGenerator);
      }
      this_00 = (cmGlobalGenerator *)0x0;
      goto LAB_00345f6a;
    }
    iVar2 = (*(*ppcVar4)->_vptr_cmGlobalGeneratorFactory[2])(*ppcVar4,&local_98,this);
    this_00 = (cmGlobalGenerator *)CONCAT44(extraout_var_00,iVar2);
    ppcVar4 = ppcVar4 + 1;
  } while (this_00 == (cmGlobalGenerator *)0x0);
  cmGlobalGenerator::SetExternalMakefileProjectGenerator(this_00,extraGenerator);
LAB_00345f6a:
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string(local_70);
  return this_00;
}

Assistant:

cmGlobalGenerator* cmake::CreateGlobalGenerator(const std::string& gname)
{
  std::pair<cmExternalMakefileProjectGenerator*, std::string> extra =
    createExtraGenerator(this->ExtraGenerators, gname);
  cmExternalMakefileProjectGenerator* extraGenerator = extra.first;
  const std::string name = extra.second;

  cmGlobalGenerator* generator = CM_NULLPTR;
  for (RegisteredGeneratorsVector::const_iterator i = this->Generators.begin();
       i != this->Generators.end(); ++i) {
    generator = (*i)->CreateGlobalGenerator(name, this);
    if (generator) {
      break;
    }
  }

  if (generator) {
    generator->SetExternalMakefileProjectGenerator(extraGenerator);
  } else {
    delete extraGenerator;
  }

  return generator;
}